

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LaTeX.cpp
# Opt level: O2

string * __thiscall
Shell::LaTeX::toString_abi_cxx11_
          (string *__return_storage_ptr__,LaTeX *this,TermList *terms,bool single)

{
  bool bVar1;
  ulong uVar2;
  undefined8 extraout_RDX;
  undefined8 uVar3;
  undefined8 extraout_RDX_00;
  uint64_t uVar4;
  uint uVar5;
  string *this_00;
  LaTeX *this_01;
  Int *this_02;
  string result;
  string to;
  string from;
  string template_str;
  string local_50;
  
  if ((terms->_content & 3) == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",(allocator<char> *)&result);
  }
  else {
    this_00 = (string *)0x73f94e;
    if (single) {
      this_00 = (string *)0x75f06b;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&result,(char *)this_00,(allocator<char> *)&template_str);
    bVar1 = true;
    do {
      uVar4 = terms->_content;
      if (((uint)uVar4 & 3) == 2) {
        if (!single) {
          std::operator+(__return_storage_ptr__,&result,")");
          goto LAB_0055aeb3;
        }
        break;
      }
      if (!bVar1) {
        this_00 = (string *)0x7412b2;
        std::__cxx11::string::append((char *)&result);
        uVar4 = terms->_content;
      }
      if ((uVar4 & 1) == 0) {
        this_01 = (LaTeX *)Kernel::theory;
        Kernel::Theory::tryGetInterpretedLaTeXName_abi_cxx11_
                  (&template_str,(Theory *)Kernel::theory,*(uint *)(uVar4 + 8),false,true);
        if (template_str._M_string_length == 0) {
          symbolToString_abi_cxx11_(&to,this_01,*(uint *)(uVar4 + 8),false);
          toString_abi_cxx11_(&local_50,this,
                              (TermList *)
                              (uVar4 + (ulong)(*(uint *)(uVar4 + 0xc) & 0xfffffff) * 8 + 0x28),false
                             );
          std::operator+(&from,&to,&local_50);
          this_00 = &from;
          std::__cxx11::string::append((string *)&result);
          std::__cxx11::string::~string((string *)&from);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&to);
        }
        else {
          this_02 = (Int *)0x0;
          uVar3 = extraout_RDX;
          while (uVar5 = (uint)this_02, uVar5 < (*(uint *)(uVar4 + 0xc) & 0xfffffff)) {
            Lib::Int::toString_abi_cxx11_(&to,this_02,(uint)uVar3);
            std::operator+(&from,"a",&to);
            std::__cxx11::string::~string((string *)&to);
            toString_abi_cxx11_(&to,this,(TermList *)
                                         (uVar4 + 0x28 +
                                         ((ulong)(*(uint *)(uVar4 + 0xc) & 0xfffffff) -
                                         (long)(int)uVar5) * 8),true);
            while (uVar2 = std::__cxx11::string::find((string *)&template_str,(ulong)&from),
                  uVar2 != 0xffffffffffffffff) {
              std::__cxx11::string::replace
                        ((ulong)&template_str,uVar2,(string *)from._M_string_length);
            }
            std::__cxx11::string::~string((string *)&to);
            std::__cxx11::string::~string((string *)&from);
            uVar3 = extraout_RDX_00;
            this_02 = (Int *)(ulong)(uVar5 + 1);
          }
          this_00 = &template_str;
          std::__cxx11::string::append((string *)&result);
        }
      }
      else {
        varToString_abi_cxx11_(&template_str,(LaTeX *)this_00,(uint)(uVar4 >> 2));
        this_00 = &template_str;
        std::__cxx11::string::append((string *)&result);
      }
      std::__cxx11::string::~string((string *)&template_str);
      terms = terms + -1;
      bVar1 = false;
    } while (!single);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&result);
LAB_0055aeb3:
    std::__cxx11::string::~string((string *)&result);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string LaTeX::toString (TermList* terms,bool single) const
{
  if (terms->isEmpty()) {
    return "";
  }

  std::string result = single ? "" : " (";
  bool first=true;
  TermList* t=terms;
  while(t->isNonEmpty()) {

    if(first){
      first=false;
    }
    else{
        result += ",";
    }

//   if (_map) {
//     std::string result;
//     if (_map->toString(t,*this,result)) {
//       return result;
//     }
//   }
    if(t->isVar()) {
      ASS(t->isOrdinaryVar());
      result += varToString(t->var()); 
    }
    else {
      ASS(t->isTerm());
      Term* trm=t->term();

     //Check if this symbol has an interpreted LaTeX name
     // this should be true for all known interpreted symbols and any recorded symbols
      std::string template_str = theory->tryGetInterpretedLaTeXName(trm->functor(),false);
   
      if(template_str.empty()){
        result += symbolToString(trm->functor(), false) + toString(trm->args());
      }
      else{
        // replace arguments in the template, arg0 replaces a0 etc.
        for(unsigned i=0;i<trm->arity();i++){
          std::string from = "a"+Lib::Int::toString(i);
          std::string to = toString(trm->nthArgument(i),true);
          size_t start_pos = 0;
          while((start_pos = template_str.find(from, start_pos)) != std::string::npos) {
            template_str.replace(start_pos, from.length(), to);
            start_pos += to.length();
          }
        }
        result += template_str;
      }
    }

    if(single) break;
    t=t->next();
  }
  return single? result : result + ")";
}